

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

long data_cb(cubeb_stream *stream,void *user_ptr,void *input_buffer,void *output_buffer,long nframes
            )

{
  float fVar1;
  undefined8 uVar2;
  float fVar3;
  long in_RCX;
  float *in_RSI;
  long in_R8;
  double dVar4;
  undefined1 auVar5 [16];
  float sample;
  int i;
  double phase_increment;
  float *out;
  sine_wave_state *state;
  int local_44;
  
  fVar1 = *in_RSI;
  fVar3 = in_RSI[1];
  for (local_44 = 0; local_44 < in_R8; local_44 = local_44 + 1) {
    uVar2 = *(undefined8 *)(in_RSI + 2);
    auVar5._8_4_ = (int)((ulong)uVar2 >> 0x20);
    auVar5._0_8_ = uVar2;
    auVar5._12_4_ = 0x45300000;
    dVar4 = sin((((double)fVar1 * 6.283185307179586) / (double)(int)fVar3) *
                ((auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)));
    *(long *)(in_RSI + 2) = *(long *)(in_RSI + 2) + 1;
    *(float *)(in_RCX + (long)local_44 * 4) = (float)dVar4 * 0.8;
  }
  return in_R8;
}

Assistant:

long
data_cb(cubeb_stream * stream, void * user_ptr, void const * input_buffer,
        void * output_buffer, long nframes)
{
  sine_wave_state * state = static_cast<sine_wave_state *>(user_ptr);
  float * out = static_cast<float *>(output_buffer);
  double phase_increment = 2.0f * M_PI * state->frequency / state->sample_rate;

  for (int i = 0; i < nframes; i++) {
    float sample = sin(phase_increment * state->count);
    state->count++;
    out[i] = sample * 0.8;
  }
  return nframes;
}